

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alchitry_Loader.cpp
# Opt level: O2

void printDeviceList(void)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  ostream *poVar4;
  ulong uVar5;
  DWORD numDevs;
  uint local_80;
  allocator local_79;
  void *local_78;
  string local_70;
  string local_50;
  
  local_80 = 0;
  iVar1 = FT_CreateDeviceInfoList();
  if (iVar1 == 0) {
    if (local_80 != 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Devices: ");
      std::endl<char,std::char_traits<char>>(poVar4);
      pvVar2 = malloc((ulong)local_80 * 0x68);
      iVar1 = FT_GetDeviceInfoList(pvVar2,&local_80);
      local_78 = pvVar2;
      if (iVar1 == 0) {
        pcVar3 = (char *)((long)pvVar2 + 0x20);
        for (uVar5 = 0; uVar5 < local_80; uVar5 = uVar5 + 1) {
          poVar4 = std::operator<<((ostream *)&std::cout,"  ");
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          poVar4 = std::operator<<(poVar4,": ");
          std::__cxx11::string::string((string *)&local_70,pcVar3,&local_79);
          descriptionToName(&local_50,&local_70);
          poVar4 = std::operator<<(poVar4,(string *)&local_50);
          std::endl<char,std::char_traits<char>>(poVar4);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          pcVar3 = pcVar3 + 0x68;
        }
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Error getting device list!");
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      free(local_78);
      return;
    }
    poVar4 = (ostream *)&std::cout;
    pcVar3 = "No devices found!";
  }
  else {
    poVar4 = (ostream *)&std::cerr;
    pcVar3 = "Could not read device list!";
  }
  poVar4 = std::operator<<(poVar4,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

void printDeviceList() {
    FT_STATUS ftStatus;
    FT_DEVICE_LIST_INFO_NODE *devInfo;
    DWORD numDevs = 0;
    // create the device information list
    ftStatus = FT_CreateDeviceInfoList(&numDevs);
    if (ftStatus != FT_OK) {
        cerr << "Could not read device list!" << endl;
        return;
    }

    if (numDevs > 0) {
        cout << "Devices: " << endl;
        // allocate storage for list based on numDevs
        devInfo = (FT_DEVICE_LIST_INFO_NODE *) malloc(
                sizeof(FT_DEVICE_LIST_INFO_NODE) * numDevs);
        // get the device information list
        ftStatus = FT_GetDeviceInfoList(devInfo, &numDevs);
        if (ftStatus == FT_OK) {
            for (unsigned int i = 0; i < numDevs; i++) {
                cout << "  " << i << ": "
                     << descriptionToName(devInfo[i].Description) << endl;
            }
        } else {
            cerr << "Error getting device list!" << endl;
        }
        free(devInfo);
    } else {
        cout << "No devices found!" << endl;
    }
}